

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

char * absl::numbers_internal::FastIntToBuffer(uint64_t i,char *buffer)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint32_t i_00;
  uint32_t i_01;
  
  if (i >> 0x20 == 0) {
    pcVar1 = FastIntToBuffer((uint32_t)i,buffer);
    return pcVar1;
  }
  i_01 = (uint32_t)(i / 1000000000);
  if ((uint)(i >> 0x29) < 0x1dcd65) {
    pcVar1 = FastIntToBuffer(i_01,buffer);
  }
  else {
    i_00 = (uint32_t)(i / 100000000000);
    uVar3 = i_01 + i_00 * -100;
    pcVar1 = FastIntToBuffer(i_00,buffer);
    if (99 < uVar3) goto LAB_0022e426;
    *(undefined2 *)pcVar1 =
         *(undefined2 *)
          ((anonymous_namespace)::PutTwoDigits(unsigned_long,char*)::two_ASCII_digits +
          (ulong)uVar3 * 2);
    pcVar1 = pcVar1 + 2;
  }
  uVar3 = (uint32_t)i + i_01 * -1000000000;
  if (uVar3 < 1000000000) {
    uVar2 = uVar3 % 10000000;
    *(undefined2 *)pcVar1 =
         *(undefined2 *)
          ((anonymous_namespace)::PutTwoDigits(unsigned_long,char*)::two_ASCII_digits +
          ((ulong)uVar3 / 10000000) * 2);
    if (uVar2 < 10000000) {
      uVar3 = ((uVar2 >> 5) / 0xc35) * -100000 + uVar2;
      *(undefined2 *)(pcVar1 + 2) =
           *(undefined2 *)
            ((anonymous_namespace)::PutTwoDigits(unsigned_long,char*)::two_ASCII_digits +
            ((ulong)(uVar2 >> 5) / 0xc35) * 2);
      if (uVar3 < 100000) {
        uVar2 = uVar3 % 1000;
        *(undefined2 *)(pcVar1 + 4) =
             *(undefined2 *)
              ((anonymous_namespace)::PutTwoDigits(unsigned_long,char*)::two_ASCII_digits +
              ((ulong)uVar3 / 1000) * 2);
        if (uVar2 < 1000) {
          *(undefined2 *)(pcVar1 + 6) =
               *(undefined2 *)
                ((anonymous_namespace)::PutTwoDigits(unsigned_long,char*)::two_ASCII_digits +
                (uVar2 / 10) * 2);
          *(undefined2 *)(pcVar1 + 8) =
               *(undefined2 *)
                ((anonymous_namespace)::one_ASCII_final_digits + (ulong)(uVar2 % 10) * 2);
          return pcVar1 + 9;
        }
      }
    }
  }
LAB_0022e426:
  __assert_fail("i < 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/numbers.cc"
                ,0x81,"void absl::(anonymous namespace)::PutTwoDigits(size_t, char *)");
}

Assistant:

char* numbers_internal::FastIntToBuffer(uint64_t i, char* buffer) {
  uint32_t u32 = static_cast<uint32_t>(i);
  if (u32 == i) return numbers_internal::FastIntToBuffer(u32, buffer);

  // Here we know i has at least 10 decimal digits.
  uint64_t top_1to11 = i / 1000000000;
  u32 = static_cast<uint32_t>(i - top_1to11 * 1000000000);
  uint32_t top_1to11_32 = static_cast<uint32_t>(top_1to11);

  if (top_1to11_32 == top_1to11) {
    buffer = numbers_internal::FastIntToBuffer(top_1to11_32, buffer);
  } else {
    // top_1to11 has more than 32 bits too; print it in two steps.
    uint32_t top_8to9 = static_cast<uint32_t>(top_1to11 / 100);
    uint32_t mid_2 = static_cast<uint32_t>(top_1to11 - top_8to9 * 100);
    buffer = numbers_internal::FastIntToBuffer(top_8to9, buffer);
    PutTwoDigits(mid_2, buffer);
    buffer += 2;
  }

  // We have only 9 digits now, again the maximum uint32_t can handle fully.
  uint32_t digits = u32 / 10000000;  // 10,000,000
  u32 -= digits * 10000000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 100000;  // 100,000
  u32 -= digits * 100000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 1000;  // 1,000
  u32 -= digits * 1000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 10;
  u32 -= digits * 10;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  memcpy(buffer, one_ASCII_final_digits[u32], 2);
  return buffer + 1;
}